

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O2

void pelelm_mgvort(Box *bx,FArrayBox *derfab,int dcomp,int param_4,FArrayBox *datfab,
                  Geometry *geomdata,Real param_7,int *param_8,int param_9)

{
  long lVar1;
  long lVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  double *pdVar12;
  EBCellFlagFab *this;
  double dVar13;
  double dVar14;
  FabType FVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  int j;
  int iVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int iVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  int iVar51;
  long lVar52;
  double *pdVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  int iVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  int iVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  void *__s;
  long lVar66;
  long lVar67;
  long lVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double *local_260;
  double *local_240;
  double *local_228;
  EBCellFlag *local_200;
  
  dVar13 = (geomdata->super_CoordSys).inv_dx[0];
  dVar14 = (geomdata->super_CoordSys).inv_dx[1];
  dVar3 = (geomdata->super_CoordSys).inv_dx[2];
  uVar4 = (datfab->super_BaseFab<double>).domain.smallend.vect[0];
  uVar5 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  lVar52 = (long)(int)uVar5;
  uVar6 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar54 = (long)(int)uVar6;
  lVar16 = (long)(int)(((datfab->super_BaseFab<double>).domain.bigend.vect[0] - uVar4) + 1);
  lVar29 = (long)(int)(((datfab->super_BaseFab<double>).domain.bigend.vect[1] - uVar5) + 1);
  lVar30 = lVar29 * lVar16;
  lVar47 = (long)(int)(((datfab->super_BaseFab<double>).domain.bigend.vect[2] - uVar6) + 1);
  lVar68 = lVar30 * lVar47;
  local_240 = (derfab->super_BaseFab<double>).dptr;
  iVar51 = (derfab->super_BaseFab<double>).domain.smallend.vect[0];
  lVar39 = (long)iVar51;
  iVar46 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  lVar48 = (long)iVar46;
  iVar42 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar17 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar51) + 1);
  lVar18 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar46) + 1);
  lVar19 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar42) + 1);
  lVar65 = (long)dcomp;
  pdVar12 = (datfab->super_BaseFab<double>).dptr;
  this = (EBCellFlagFab *)datfab[1].super_BaseFab<double>._vptr_BaseFab;
  FVar15 = amrex::EBCellFlagFab::getType(this,bx);
  if (FVar15 == singlevalued) {
    iVar38 = (bx->smallend).vect[0];
    iVar51 = (bx->smallend).vect[2];
    lVar24 = (long)iVar51;
    lVar55 = lVar47 * 8;
    iVar46 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
    local_240 = local_240 + (iVar38 - lVar39);
    iVar7 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
    iVar8 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
    lVar66 = (long)(((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] - iVar46) + 1);
    lVar23 = (long)(((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] - iVar7) + 1);
    local_200 = (this->super_BaseFab<amrex::EBCellFlag>).dptr + ((long)iVar38 - (long)iVar46);
    iVar9 = (bx->smallend).vect[1];
    iVar57 = (bx->bigend).vect[0];
    iVar10 = (bx->bigend).vect[1];
    iVar11 = (bx->bigend).vect[2];
    iVar35 = iVar38 - uVar4;
    pdVar53 = pdVar12 + ((long)iVar38 - (long)(int)uVar4);
    lVar56 = (lVar47 * 0x10 + lVar24 * 8 + lVar54 * -8) * lVar29;
    lVar25 = (lVar24 - lVar54) * lVar29 * 8;
    lVar37 = lVar52 * -8;
    iVar27 = iVar51 - uVar6;
    iVar46 = (iVar51 - uVar6) + -1;
    iVar61 = (iVar51 - uVar6) + 2;
    iVar51 = iVar27 + -2;
    lVar39 = lVar29 * 8;
    lVar47 = lVar24;
    local_228 = pdVar53;
    while (iVar27 = iVar27 + 1, lVar47 <= iVar11) {
      lVar58 = (lVar47 - lVar54) * lVar30;
      lVar34 = (long)iVar9;
      while (lVar34 <= iVar10) {
        if (iVar57 < iVar38) {
          lVar34 = lVar34 + 1;
        }
        else {
          lVar26 = (lVar34 - lVar52) * lVar16;
          lVar1 = lVar34 + 1;
          lVar67 = (long)(int)((int)lVar1 - uVar5);
          lVar20 = (long)(int)(~uVar5 + (int)lVar34);
          iVar28 = (int)lVar34 - uVar5;
          lVar62 = (long)(iVar28 + 2);
          lVar31 = (long)(iVar28 + -2);
          lVar50 = (lVar56 + lVar52 * -8 + lVar34 * 8) * lVar16;
          lVar64 = ((lVar55 + lVar24 * 8 + lVar54 * -8) * lVar29 + lVar52 * -8 + lVar34 * 8) *
                   lVar16;
          lVar32 = (lVar56 + lVar20 * 8) * lVar16;
          lVar21 = (lVar25 + lVar20 * 8) * lVar16;
          lVar22 = (lVar25 + lVar52 * -8 + lVar34 * 8) * lVar16;
          lVar20 = lVar34 * 8;
          lVar2 = lVar34 * 8;
          lVar43 = (((long)iVar46 * 8 + lVar55) * lVar29 + lVar37 + lVar34 * 8) * lVar16;
          lVar44 = (iVar46 * lVar39 + lVar37 + lVar34 * 8) * lVar16;
          lVar41 = lVar34 * 8;
          lVar45 = lVar34 * 8;
          lVar49 = lVar34 * 8;
          lVar59 = ((lVar55 + (long)iVar27 * 8) * lVar29 + lVar37 + lVar34 * 8) * lVar16;
          lVar60 = (iVar27 * lVar39 + lVar37 + lVar34 * 8) * lVar16;
          lVar33 = (lVar56 + lVar67 * 8) * lVar16;
          lVar36 = (lVar25 + lVar67 * 8) * lVar16;
          lVar67 = lVar34 * 4;
          lVar63 = 0;
          do {
            uVar6 = *(uint32_t *)
                     ((long)&local_200[lVar63].flag +
                     ((lVar24 - iVar8) * lVar23 * 4 + (long)iVar7 * -4 + lVar67) * lVar66);
            dVar69 = 0.0;
            if ((~uVar6 & 3) != 0) {
              iVar28 = (int)lVar63;
              if ((uVar6 >> 0x13 & 1) == 0) {
                lVar40 = (long)(int)(~uVar4 + iVar38 + iVar28);
                lVar34 = (long)(int)((iVar38 - uVar4) + -2 + iVar28);
                dVar69 = -(pdVar12[lVar26 + lVar58 + lVar34 + lVar68] * -0.5 +
                          *(double *)((long)local_228 + lVar63 * 8 + lVar64) * -1.5 +
                          pdVar12[lVar26 + lVar58 + lVar40 + lVar68] +
                          pdVar12[lVar26 + lVar58 + lVar40 + lVar68]);
                dVar70 = -(pdVar12[lVar26 + lVar58 + lVar34 + lVar68 * 2] * -0.5 +
                          *(double *)((long)local_228 + lVar63 * 8 + lVar50) * -1.5 +
                          pdVar12[lVar26 + lVar58 + lVar40 + lVar68 * 2] +
                          pdVar12[lVar26 + lVar58 + lVar40 + lVar68 * 2]);
              }
              else if ((uVar6 >> 0x11 & 1) == 0) {
                lVar34 = (long)(iVar35 + iVar28 + 1);
                lVar40 = (long)(iVar35 + 2 + iVar28);
                dVar69 = pdVar12[lVar26 + lVar58 + lVar40 + lVar68] * -0.5 +
                         *(double *)((long)local_228 + lVar63 * 8 + lVar64) * -1.5 +
                         pdVar12[lVar26 + lVar58 + lVar34 + lVar68] +
                         pdVar12[lVar26 + lVar58 + lVar34 + lVar68];
                dVar70 = pdVar12[lVar26 + lVar58 + lVar40 + lVar68 * 2] * -0.5 +
                         *(double *)((long)local_228 + lVar63 * 8 + lVar50) * -1.5 +
                         pdVar12[lVar26 + lVar58 + lVar34 + lVar68 * 2] +
                         pdVar12[lVar26 + lVar58 + lVar34 + lVar68 * 2];
              }
              else {
                lVar34 = (long)(iVar35 + iVar28 + 1);
                lVar40 = (long)(int)(~uVar4 + iVar38 + iVar28);
                dVar69 = (pdVar12[lVar26 + lVar58 + lVar34 + lVar68] -
                         pdVar12[lVar26 + lVar58 + lVar40 + lVar68]) * 0.5;
                dVar70 = (pdVar12[lVar26 + lVar58 + lVar34 + lVar68 * 2] -
                         pdVar12[lVar26 + lVar58 + lVar40 + lVar68 * 2]) * 0.5;
              }
              if ((uVar6 >> 0x15 & 1) == 0) {
                dVar71 = *(double *)((long)local_228 + lVar63 * 8 + lVar21);
                dVar72 = *(double *)((long)local_228 + lVar63 * 8 + lVar32);
                dVar71 = -(*(double *)
                            ((long)local_228 + lVar63 * 8 + (lVar25 + lVar31 * 8) * lVar16) * -0.5 +
                          *(double *)((long)local_228 + lVar63 * 8 + lVar22) * -1.5 +
                          dVar71 + dVar71);
                dVar72 = -(*(double *)
                            ((long)local_228 + lVar63 * 8 + (lVar56 + lVar31 * 8) * lVar16) * -0.5 +
                          *(double *)((long)local_228 + lVar63 * 8 + lVar50) * -1.5 +
                          dVar72 + dVar72);
              }
              else if ((short)uVar6 < 0) {
                dVar71 = (*(double *)((long)local_228 + lVar63 * 8 + lVar36) -
                         *(double *)((long)local_228 + lVar63 * 8 + lVar21)) * 0.5;
                dVar72 = (*(double *)((long)local_228 + lVar63 * 8 + lVar33) -
                         *(double *)((long)local_228 + lVar63 * 8 + lVar32)) * 0.5;
              }
              else {
                dVar71 = *(double *)((long)local_228 + lVar63 * 8 + lVar36);
                dVar72 = *(double *)((long)local_228 + lVar63 * 8 + lVar33);
                dVar71 = *(double *)((long)local_228 + lVar63 * 8 + (lVar25 + lVar62 * 8) * lVar16)
                         * -0.5 + *(double *)((long)local_228 + lVar63 * 8 + lVar22) * -1.5 +
                                  dVar71 + dVar71;
                dVar72 = *(double *)((long)local_228 + lVar63 * 8 + (lVar56 + lVar62 * 8) * lVar16)
                         * -0.5 + *(double *)((long)local_228 + lVar63 * 8 + lVar50) * -1.5 +
                                  dVar72 + dVar72;
              }
              if ((uVar6 >> 0x1b & 1) == 0) {
                dVar73 = *(double *)((long)pdVar53 + lVar63 * 8 + lVar44);
                dVar74 = *(double *)((long)pdVar53 + lVar63 * 8 + lVar43);
                dVar73 = -(*(double *)
                            ((long)pdVar53 +
                            lVar63 * 8 + (iVar51 * lVar39 + lVar37 + lVar2) * lVar16) * -0.5 +
                          *(double *)((long)local_228 + lVar63 * 8 + lVar22) * -1.5 +
                          dVar73 + dVar73);
                dVar74 = -(*(double *)
                            ((long)pdVar53 +
                            lVar63 * 8 +
                            (((long)iVar51 * 8 + lVar55) * lVar29 + lVar37 + lVar20) * lVar16) *
                           -0.5 + *(double *)((long)local_228 + lVar63 * 8 + lVar64) * -1.5 +
                                  dVar74 + dVar74);
              }
              else if ((uVar6 >> 9 & 1) == 0) {
                dVar73 = *(double *)((long)pdVar53 + lVar63 * 8 + lVar60);
                dVar74 = *(double *)((long)pdVar53 + lVar63 * 8 + lVar59);
                dVar73 = *(double *)
                          ((long)pdVar53 + lVar63 * 8 + (iVar61 * lVar39 + lVar37 + lVar49) * lVar16
                          ) * -0.5 +
                         *(double *)((long)local_228 + lVar63 * 8 + lVar22) * -1.5 + dVar73 + dVar73
                ;
                dVar74 = *(double *)
                          ((long)pdVar53 +
                          lVar63 * 8 +
                          (((long)iVar61 * 8 + lVar55) * lVar29 + lVar37 + lVar45) * lVar16) * -0.5
                         + *(double *)((long)local_228 + lVar63 * 8 + lVar64) * -1.5 +
                           dVar74 + dVar74;
              }
              else {
                dVar73 = (*(double *)((long)pdVar53 + lVar63 * 8 + lVar60) -
                         *(double *)((long)pdVar53 + lVar63 * 8 + lVar44)) * 0.5;
                dVar74 = (*(double *)((long)pdVar53 + lVar63 * 8 + lVar59) -
                         *(double *)((long)pdVar53 + lVar63 * 8 + lVar43)) * 0.5;
              }
              dVar71 = dVar13 * dVar69 - dVar71 * dVar14;
              dVar69 = dVar3 * dVar73 - dVar70 * dVar13;
              dVar70 = dVar14 * dVar72 - dVar74 * dVar3;
              dVar69 = SQRT(dVar71 * dVar71 + dVar70 * dVar70 + dVar69 * dVar69);
            }
            *(double *)
             ((long)local_240 +
             lVar63 * 8 +
             ((lVar24 * 8 + lVar65 * lVar19 * 8 + (long)iVar42 * -8) * lVar18 + lVar48 * -8 + lVar41
             ) * lVar17) = dVar69;
            lVar63 = lVar63 + 1;
            lVar34 = lVar1;
          } while ((iVar57 - iVar38) + 1 != (int)lVar63);
        }
      }
      local_228 = local_228 + lVar30;
      iVar51 = iVar51 + 1;
      iVar46 = iVar46 + 1;
      local_240 = local_240 + lVar18 * lVar17;
      iVar61 = iVar61 + 1;
      local_200 = local_200 + lVar23 * lVar66;
      lVar47 = lVar47 + 1;
    }
  }
  else if (FVar15 == covered) {
    iVar51 = (bx->smallend).vect[0];
    iVar46 = (bx->smallend).vect[1];
    iVar38 = (bx->smallend).vect[2];
    iVar7 = (bx->bigend).vect[0];
    iVar8 = (bx->bigend).vect[1];
    iVar9 = (bx->bigend).vect[2];
    iVar42 = iVar38 - iVar42;
    for (lVar16 = (long)iVar38; lVar16 <= iVar9; lVar16 = lVar16 + 1) {
      __s = (void *)((long)local_240 +
                    ((long)iVar42 * lVar18 * lVar17 + (long)iVar51) * 8 +
                    ((long)iVar46 * 8 + lVar65 * lVar18 * lVar19 * 8 + lVar48 * -8) * lVar17 +
                    lVar39 * -8);
      for (iVar38 = iVar46; iVar38 <= iVar8; iVar38 = iVar38 + 1) {
        if (iVar51 <= iVar7) {
          memset(__s,0,(ulong)(uint)(iVar7 - iVar51) * 8 + 8);
        }
        __s = (void *)((long)__s + lVar17 * 8);
      }
      iVar42 = iVar42 + 1;
    }
  }
  else {
    iVar51 = (bx->smallend).vect[0];
    iVar46 = (bx->smallend).vect[1];
    iVar38 = (bx->smallend).vect[2];
    lVar37 = (long)iVar38;
    iVar7 = (bx->bigend).vect[0];
    iVar8 = (bx->bigend).vect[1];
    iVar9 = (bx->bigend).vect[2];
    local_240 = local_240 + (iVar51 - lVar39);
    lVar39 = lVar37 * 8;
    pdVar53 = pdVar12 + ((long)iVar51 - (long)(int)uVar4);
    lVar23 = lVar52 * -8;
    iVar57 = ~uVar6 + iVar38;
    iVar38 = iVar38 - uVar6;
    lVar55 = (lVar47 * 0x10 + lVar37 * 8 + lVar54 * -8) * lVar29;
    lVar56 = (lVar37 - lVar54) * lVar29 * 8;
    local_260 = pdVar53;
    while (iVar38 = iVar38 + 1, lVar37 <= iVar9) {
      lVar24 = (lVar37 - lVar54) * lVar30;
      lVar37 = lVar37 + 1;
      lVar25 = (long)iVar46;
      while (lVar25 <= iVar8) {
        if (iVar7 < iVar51) {
          lVar25 = lVar25 + 1;
        }
        else {
          lVar45 = (lVar25 - lVar52) * lVar16;
          lVar66 = lVar25 + 1;
          lVar67 = (long)(int)((int)lVar66 - uVar5);
          lVar49 = (long)(int)((int)lVar25 + ~uVar5);
          lVar34 = lVar25 * 8;
          lVar58 = lVar25 * 8;
          lVar1 = lVar25 * 8;
          lVar20 = lVar25 * 8;
          lVar2 = lVar25 * 8;
          lVar41 = 0;
          do {
            lVar25 = (long)(int)((iVar51 - uVar4) + 1 + (int)lVar41);
            lVar26 = (long)(int)(~uVar4 + iVar51 + (int)lVar41);
            dVar71 = (*(double *)((long)local_260 + lVar41 * 8 + (lVar55 + lVar67 * 8) * lVar16) -
                     *(double *)((long)local_260 + lVar41 * 8 + (lVar55 + lVar49 * 8) * lVar16)) *
                     0.5 * dVar14 -
                     (*(double *)
                       ((long)pdVar53 +
                       lVar41 * 8 +
                       ((lVar47 * 8 + (long)iVar38 * 8) * lVar29 + lVar23 + lVar20) * lVar16) -
                     *(double *)
                      ((long)pdVar53 +
                      lVar41 * 8 +
                      ((lVar47 * 8 + (long)iVar57 * 8) * lVar29 + lVar23 + lVar58) * lVar16)) * 0.5
                     * dVar3;
            dVar70 = (*(double *)
                       ((long)pdVar53 +
                       lVar41 * 8 + ((long)iVar38 * lVar29 * 8 + lVar23 + lVar2) * lVar16) -
                     *(double *)
                      ((long)pdVar53 +
                      lVar41 * 8 + ((long)iVar57 * lVar29 * 8 + lVar23 + lVar1) * lVar16)) * 0.5 *
                     dVar3 - (pdVar12[lVar45 + lVar24 + lVar25 + lVar68 * 2] -
                             pdVar12[lVar45 + lVar24 + lVar26 + lVar68 * 2]) * 0.5 * dVar13;
            dVar69 = (pdVar12[lVar45 + lVar24 + lVar25 + lVar68] -
                     pdVar12[lVar45 + lVar24 + lVar26 + lVar68]) * 0.5 * dVar13 -
                     (*(double *)((long)local_260 + lVar41 * 8 + (lVar56 + lVar67 * 8) * lVar16) -
                     *(double *)((long)local_260 + lVar41 * 8 + (lVar56 + lVar49 * 8) * lVar16)) *
                     0.5 * dVar14;
            *(double *)
             ((long)local_240 +
             lVar41 * 8 +
             ((lVar39 + lVar65 * lVar19 * 8 + (long)iVar42 * -8) * lVar18 + lVar48 * -8 + lVar34) *
             lVar17) = SQRT(dVar69 * dVar69 + dVar71 * dVar71 + dVar70 * dVar70);
            lVar41 = lVar41 + 1;
            lVar25 = lVar66;
          } while ((iVar7 - iVar51) + 1 != (int)lVar41);
        }
      }
      local_240 = local_240 + lVar18 * lVar17;
      iVar57 = iVar57 + 1;
      local_260 = local_260 + lVar30;
    }
  }
  return;
}

Assistant:

void pelelm_mgvort (const Box& bx, FArrayBox& derfab, int dcomp, int /*ncomp*/,
                    const FArrayBox& datfab, const Geometry& geomdata,
                    Real /*time*/, const int* /*bcrec*/, int /*level*/)

{
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(datfab.box().contains(bx));

    AMREX_D_TERM(const amrex::Real idx = geomdata.InvCellSize(0);,
                 const amrex::Real idy = geomdata.InvCellSize(1);,
                 const amrex::Real idz = geomdata.InvCellSize(2););

    amrex::Array4<amrex::Real const> const& dat_arr = datfab.const_array();
    amrex::Array4<amrex::Real>       const&vort_arr = derfab.array(dcomp);

#ifdef AMREX_USE_EB
    const EBFArrayBox& ebfab = static_cast<EBFArrayBox const&>(datfab);
    const EBCellFlagFab& flags = ebfab.getEBCellFlagFab();
    auto typ = flags.getType(bx);
    if (typ == FabType::covered)
    {
        amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            vort_arr(i,j,k) = 0.0;
        });
    } else if (typ == FabType::singlevalued)
    {
       const auto& flag_fab = flags.const_array();
       amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
       {
          constexpr amrex::Real c0 = -1.5;
          constexpr amrex::Real c1 = 2.0;
          constexpr amrex::Real c2 = -0.5;
          if (flag_fab(i,j,k).isCovered()) {
             vort_arr(i,j,k) = 0.0;
          } else {
             amrex::Real vx = 0.0;
             amrex::Real uy = 0.0;
#if ( AMREX_SPACEDIM == 2 )
             // Need to check if there are covered cells in neighbours --
             // -- if so, use one-sided difference computation (but still quadratic)
             if (!flag_fab(i,j,k).isConnected( 1,0,0)) {
                vx = - (c0 * dat_arr(i  ,j,k,1)
                      + c1 * dat_arr(i-1,j,k,1)
                      + c2 * dat_arr(i-2,j,k,1)) * idx;
             } else if (!flag_fab(i,j,k).isConnected(-1,0,0)) {
                vx = (c0 * dat_arr(i  ,j,k,1)
                    + c1 * dat_arr(i+1,j,k,1)
                    + c2 * dat_arr(i+2,j,k,1)) * idx;
             } else {
                vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
             }
             // Do the same in y-direction
             if (!flag_fab(i,j,k).isConnected( 0,1,0)) {
                uy = - (c0 * dat_arr(i,j  ,k,0)
                      + c1 * dat_arr(i,j-1,k,0)
                      + c2 * dat_arr(i,j-2,k,0)) * idy;
             } else if (!flag_fab(i,j,k).isConnected(0,-1,0)) {
                uy = (c0 * dat_arr(i,j  ,k,0)
                    + c1 * dat_arr(i,j+1,k,0)
                    + c2 * dat_arr(i,j+2,k,0)) * idy;
             } else {
                uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;
             }
             vort_arr(i,j,k) = vx-uy;
#elif ( AMREX_SPACEDIM == 3 )
             amrex::Real wx = 0.0;
             amrex::Real wy = 0.0;
             amrex::Real uz = 0.0;
             amrex::Real vz = 0.0;
             // Need to check if there are covered cells in neighbours --
             // -- if so, use one-sided difference computation (but still quadratic)
             if (!flag_fab(i,j,k).isConnected( 1,0,0)) {
                // Covered cell to the right, go fish left
                vx = - (c0 * dat_arr(i  ,j,k,1)
                      + c1 * dat_arr(i-1,j,k,1)
                      + c2 * dat_arr(i-2,j,k,1)) * idx;
                wx = - (c0 * dat_arr(i  ,j,k,2)
                      + c1 * dat_arr(i-1,j,k,2)
                      + c2 * dat_arr(i-2,j,k,2)) * idx;
             } else if (!flag_fab(i,j,k).isConnected(-1,0,0)) {
                // Covered cell to the left, go fish right
                vx = (c0 * dat_arr(i  ,j,k,1)
                    + c1 * dat_arr(i+1,j,k,1)
                    + c2 * dat_arr(i+2,j,k,1)) * idx;
                wx = (c0 * dat_arr(i  ,j,k,2)
                    + c1 * dat_arr(i+1,j,k,2)
                    + c2 * dat_arr(i+2,j,k,2)) * idx;
             } else {
                // No covered cells right or left, use standard stencil
                vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
                wx = 0.5 * (dat_arr(i+1,j,k,2) - dat_arr(i-1,j,k,2)) * idx;
             }
             // Do the same in y-direction
             if (!flag_fab(i,j,k).isConnected(0, 1,0)) {
                 uy = - (c0 * dat_arr(i,j  ,k,0)
                       + c1 * dat_arr(i,j-1,k,0)
                       + c2 * dat_arr(i,j-2,k,0)) * idy;
                 wy = - (c0 * dat_arr(i,j  ,k,2)
                       + c1 * dat_arr(i,j-1,k,2)
                       + c2 * dat_arr(i,j-2,k,2)) * idy;
             } else if (!flag_fab(i,j,k).isConnected(0,-1,0)) {
                 uy = (c0 * dat_arr(i,j  ,k,0)
                     + c1 * dat_arr(i,j+1,k,0)
                     + c2 * dat_arr(i,j+2,k,0)) * idy;
                 wy = (c0 * dat_arr(i,j  ,k,2)
                     + c1 * dat_arr(i,j+1,k,2)
                     + c2 * dat_arr(i,j+2,k,2)) * idy;
             } else {
                 uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;
                 wy = 0.5 * (dat_arr(i,j+1,k,2) - dat_arr(i,j-1,k,2)) * idy;
             }
             // Do the same in z-direction
             if (!flag_fab(i,j,k).isConnected(0,0, 1)) {
                 uz = - (c0 * dat_arr(i,j,k  ,0)
                       + c1 * dat_arr(i,j,k-1,0)
                       + c2 * dat_arr(i,j,k-2,0)) * idz;
                 vz = - (c0 * dat_arr(i,j,k  ,1)
                       + c1 * dat_arr(i,j,k-1,1)
                       + c2 * dat_arr(i,j,k-2,1)) * idz;
             } else if (!flag_fab(i,j,k).isConnected(0,0,-1)) {
                 uz = (c0 * dat_arr(i,j,k  ,0)
                     + c1 * dat_arr(i,j,k+1,0)
                     + c2 * dat_arr(i,j,k+2,0)) * idz;
                 vz = (c0 * dat_arr(i,j,k  ,1)
                     + c1 * dat_arr(i,j,k+1,1)
                     + c2 * dat_arr(i,j,k+2,1)) * idz;
             } else {
                 uz = 0.5 * (dat_arr(i,j,k+1,0) - dat_arr(i,j,k-1,0)) * idz;
                 vz = 0.5 * (dat_arr(i,j,k+1,1) - dat_arr(i,j,k-1,1)) * idz;
             }
             vort_arr(i,j,k) = std::sqrt((wy-vz)*(wy-vz) + (uz-wx)*(uz-wx) + (vx-uy)*(vx-uy));
#endif
          }
       });
    } else
#endif
    {
        amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
#if ( AMREX_SPACEDIM == 2 )
            amrex::Real vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
            amrex::Real uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;
            vort_arr(i,j,k) = vx-uy;

#elif ( AMREX_SPACEDIM == 3 )
            amrex::Real vx = 0.5 * (dat_arr(i+1,j,k,1) - dat_arr(i-1,j,k,1)) * idx;
            amrex::Real wx = 0.5 * (dat_arr(i+1,j,k,2) - dat_arr(i-1,j,k,2)) * idx;

            amrex::Real uy = 0.5 * (dat_arr(i,j+1,k,0) - dat_arr(i,j-1,k,0)) * idy;
            amrex::Real wy = 0.5 * (dat_arr(i,j+1,k,2) - dat_arr(i,j-1,k,2)) * idy;

            amrex::Real uz = 0.5 * (dat_arr(i,j,k+1,0) - dat_arr(i,j,k-1,0)) * idz;
            amrex::Real vz = 0.5 * (dat_arr(i,j,k+1,1) - dat_arr(i,j,k-1,1)) * idz;

            vort_arr(i,j,k) = std::sqrt((wy-vz)*(wy-vz) + (uz-wx)*(uz-wx) + (vx-uy)*(vx-uy));
#endif
        });
    }
}